

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlitFboCase::init(BlitFboCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  *this_00;
  pointer *ppBVar1;
  ostringstream *poVar2;
  Context *this_01;
  RenderContext *renderCtx;
  BlitArgs *__first;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
  data_01;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data_02;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_03;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  data_04;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  int iVar9;
  ContextType ctxType;
  deUint32 dVar10;
  RenderTarget RVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  RenderTarget *pRVar19;
  undefined4 extraout_var;
  TypedObjectWrapper<(glu::ObjectType)2> *pTVar20;
  TypedObjectWrapper<(glu::ObjectType)3> *pTVar21;
  ShaderProgram *pSVar22;
  ProgramSources *pPVar23;
  TypedObjectWrapper<(glu::ObjectType)1> *this_02;
  pointer pBVar24;
  pointer extraout_RAX;
  ulong uVar25;
  ulong uVar26;
  BlitArgs *__result;
  BlitArgs *pBVar27;
  BlitArgs *pBVar28;
  long lVar29;
  NotSupportedError *pNVar30;
  TestError *this_03;
  undefined8 in_RCX;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs> *__alloc;
  ShaderType SVar31;
  char *pcVar32;
  char *pcVar33;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs> *paVar34;
  float fVar35;
  float fVar36;
  float __tmp;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined1 local_268 [40];
  Random rnd;
  undefined1 local_230 [40];
  BlitFboCase *local_208;
  BlitArgs args;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_80;
  string local_70;
  string local_50;
  
  pRVar19 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar41 = pRVar19->m_numSamples;
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar29 = CONCAT44(extraout_var,iVar9);
  deRandom_init(&rnd.m_rnd,0xabc123);
  args.src.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(args.src.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Using BlitFramebuffer to blit area from ");
  pcVar32 = "fbo";
  pcVar33 = "fbo";
  if (this->m_src == TARGET_DEFAULT) {
    pcVar33 = "default fb";
  }
  std::operator<<((ostream *)poVar2,pcVar33);
  std::operator<<((ostream *)poVar2," to ");
  if (this->m_dst == TARGET_DEFAULT) {
    pcVar32 = "default fb";
  }
  std::operator<<((ostream *)poVar2,pcVar32);
  std::operator<<((ostream *)poVar2,".\n");
  std::operator<<((ostream *)poVar2,
                  "Varying blit arguments and primitive bounding box between iterations.\n");
  std::operator<<((ostream *)poVar2,"Expecting bounding box to have no effect on blitting.\n");
  std::operator<<((ostream *)poVar2,"Source framebuffer is filled with green-yellow grid.\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&args,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar8 = glu::contextSupports(ctxType,(ApiType)0x23);
  if ((!bVar8) &&
     (bVar8 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_EXT_primitive_bounding_box"), !bVar8)) {
    pNVar30 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&args,"Test requires GL_EXT_primitive_bounding_box extension",
               (allocator<char> *)local_268);
    tcu::NotSupportedError::NotSupportedError(pNVar30,(string *)&args);
    __cxa_throw(pNVar30,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pcVar32 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),iVar41 < 2);
  RVar11 = this->m_dst;
  if (RVar11 == TARGET_DEFAULT && iVar41 >= 2) {
    pNVar30 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&args,"Test requires non-multisampled default framebuffer",
               (allocator<char> *)local_268);
    tcu::NotSupportedError::NotSupportedError(pNVar30,(string *)&args);
    __cxa_throw(pNVar30,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_src == TARGET_FBO) {
    pTVar20 = (TypedObjectWrapper<(glu::ObjectType)2> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
              (pTVar20,((this->super_TestCase).m_context)->m_renderCtx);
    args.src.m_data[0] = 0;
    args.src.m_data[1] = 0;
    data.ptr._4_4_ = in_stack_fffffffffffffd8c;
    data.ptr._0_4_ = iVar41;
    data._8_4_ = in_stack_fffffffffffffd90;
    data._12_4_ = in_stack_fffffffffffffd94;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::assignData(&(this->m_srcRbo).
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ,data);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   *)&args);
    (**(code **)(lVar29 + 0xa0))
              (0x8d41,(((this->m_srcRbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar29 + 0x1238))(0x8d41,0x8058,0x100,0x100);
    dVar10 = (**(code **)(lVar29 + 0x800))();
    glu::checkError(dVar10,"src rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd39);
    pTVar21 = (TypedObjectWrapper<(glu::ObjectType)3> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (pTVar21,((this->super_TestCase).m_context)->m_renderCtx);
    args.src.m_data[0] = 0;
    args.src.m_data[1] = 0;
    data_00.ptr._4_4_ = in_stack_fffffffffffffd8c;
    data_00.ptr._0_4_ = iVar41;
    data_00._8_4_ = in_stack_fffffffffffffd90;
    data_00._12_4_ = in_stack_fffffffffffffd94;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::assignData(&(this->m_srcFbo).
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 ,data_00);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                   *)&args);
    (**(code **)(lVar29 + 0x78))
              (0x8d40,(((this->m_srcFbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar29 + 0x688))
              (0x8d40,0x8ce0,0x8d41,
               (((this->m_srcRbo).
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 .m_data.ptr)->super_ObjectWrapper).m_object);
    dVar10 = (**(code **)(lVar29 + 0x800))();
    pcVar32 = (char *)0xd3e;
    glu::checkError(dVar10,"src fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd3e);
    RVar11 = this->m_dst;
  }
  if (RVar11 == TARGET_FBO) {
    pTVar20 = (TypedObjectWrapper<(glu::ObjectType)2> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
              (pTVar20,((this->super_TestCase).m_context)->m_renderCtx);
    args.src.m_data[0] = 0;
    args.src.m_data[1] = 0;
    this_00 = &this->m_dstRbo;
    data_01.ptr._4_4_ = in_stack_fffffffffffffd8c;
    data_01.ptr._0_4_ = iVar41;
    data_01._8_4_ = in_stack_fffffffffffffd90;
    data_01._12_4_ = in_stack_fffffffffffffd94;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::assignData(&this_00->
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ,data_01);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                   *)&args);
    (**(code **)(lVar29 + 0xa0))
              (0x8d41,(((this_00->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar29 + 0x1238))(0x8d41,0x8058,0x100,0x100);
    dVar10 = (**(code **)(lVar29 + 0x800))();
    glu::checkError(dVar10,"dst rbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd46);
    pTVar21 = (TypedObjectWrapper<(glu::ObjectType)3> *)operator_new(0x18);
    glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
              (pTVar21,((this->super_TestCase).m_context)->m_renderCtx);
    args.src.m_data[0] = 0;
    args.src.m_data[1] = 0;
    data_02.ptr._4_4_ = in_stack_fffffffffffffd8c;
    data_02.ptr._0_4_ = iVar41;
    data_02._8_4_ = in_stack_fffffffffffffd90;
    data_02._12_4_ = in_stack_fffffffffffffd94;
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::assignData(&(this->m_dstFbo).
                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 ,data_02);
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
    ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                   *)&args);
    (**(code **)(lVar29 + 0x78))
              (0x8d40,(((this->m_dstFbo).
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        .m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(lVar29 + 0x688))
              (0x8d40,0x8ce0,0x8d41,
               (((this_00->
                 super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)2>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)2>_>_>
                 ).m_data.ptr)->super_ObjectWrapper).m_object);
    dVar10 = (**(code **)(lVar29 + 0x800))();
    pcVar32 = (char *)0xd4b;
    glu::checkError(dVar10,"dst fbo",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xd4b);
  }
  pSVar22 = (ShaderProgram *)operator_new(0xd0);
  this_01 = (this->super_TestCase).m_context;
  renderCtx = this_01->m_renderCtx;
  memset(&args,0,0xac);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)this_01,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_position;\nvoid main()\n{\n\tgl_Position = a_position;\n\tv_position = a_position;\n}\n"
             ,pcVar32);
  glu::VertexSource::VertexSource((VertexSource *)local_268,&local_50);
  pPVar23 = glu::ProgramSources::operator<<((ProgramSources *)&args,(ShaderSource *)local_268);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\nin mediump vec4 v_position;\nlayout(location=0) out mediump vec4 dEQP_FragColor;\nvoid main()\n{\n\tconst mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n\tdEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n}\n"
             ,pcVar32);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_230,&local_70);
  pPVar23 = glu::ProgramSources::operator<<(pPVar23,(ShaderSource *)local_230);
  glu::ShaderProgram::ShaderProgram(pSVar22,renderCtx,pPVar23);
  local_80.m_data.ptr = (ShaderProgram *)0x0;
  data_03.ptr._4_4_ = in_stack_fffffffffffffd8c;
  data_03.ptr._0_4_ = iVar41;
  data_03._8_4_ = in_stack_fffffffffffffd90;
  data_03._12_4_ = in_stack_fffffffffffffd94;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
            (&(this->m_program).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>,data_03)
  ;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniqueBase
            (&local_80);
  std::__cxx11::string::~string((string *)(local_230 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)(local_268 + 8));
  std::__cxx11::string::~string((string *)&local_50);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&args);
  pSVar22 = (this->m_program).
            super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr
  ;
  if ((pSVar22->m_program).m_info.linkOk == false) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar22)
    ;
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&args,"failed to build program",(allocator<char> *)local_268);
    tcu::TestError::TestError(this_03,(string *)&args);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if ((Functional::(anonymous_namespace)::BlitFboCase::init()::s_quadCoords == '\0') &&
     (iVar9 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::BlitFboCase::init()::
                                   s_quadCoords), iVar9 != 0)) {
    init::s_quadCoords[0].m_data[0] = _DAT_0167bb00;
    init::s_quadCoords[0].m_data[1] = _UNK_0167bb04;
    init::s_quadCoords[0].m_data[2] = _UNK_0167bb08;
    init::s_quadCoords[0].m_data[3] = _UNK_0167bb0c;
    init::s_quadCoords[1].m_data[0] = _DAT_0167baf0;
    init::s_quadCoords[1].m_data[1] = _UNK_0167baf4;
    init::s_quadCoords[1].m_data[2] = _UNK_0167baf8;
    init::s_quadCoords[1].m_data[3] = _UNK_0167bafc;
    init::s_quadCoords[2].m_data[0] = _DAT_0167bb20;
    init::s_quadCoords[2].m_data[1] = _UNK_0167bb24;
    init::s_quadCoords[2].m_data[2] = _UNK_0167bb28;
    init::s_quadCoords[2].m_data[3] = _UNK_0167bb2c;
    init::s_quadCoords[3].m_data[0] = _DAT_0167bb10;
    init::s_quadCoords[3].m_data[1] = _UNK_0167bb14;
    init::s_quadCoords[3].m_data[2] = _UNK_0167bb18;
    init::s_quadCoords[3].m_data[3] = _UNK_0167bb1c;
    __cxa_guard_release(&Functional::(anonymous_namespace)::BlitFboCase::init()::s_quadCoords);
  }
  this_02 = (TypedObjectWrapper<(glu::ObjectType)1> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (this_02,((this->super_TestCase).m_context)->m_renderCtx);
  args.src.m_data[0] = 0;
  args.src.m_data[1] = 0;
  data_04.ptr._4_4_ = in_stack_fffffffffffffd8c;
  data_04.ptr._0_4_ = iVar41;
  data_04._8_4_ = in_stack_fffffffffffffd90;
  data_04._12_4_ = in_stack_fffffffffffffd94;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::assignData(&(this->m_vbo).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
               ,data_04);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                 *)&args);
  (**(code **)(lVar29 + 0x40))
            (0x8892,(((this->m_vbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar29 + 0x150))(0x8892,0x40,init::s_quadCoords,0x88e4);
  dVar10 = (**(code **)(lVar29 + 0x800))();
  glu::checkError(dVar10,"set buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xd77);
  SVar31 = 0x100;
  local_268._0_4_ = 0x100;
  local_268._4_4_ = 0x100;
  if (this->m_src == TARGET_DEFAULT) {
    pRVar19 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_268._0_4_ = pRVar19->m_width;
    pRVar19 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_268._4_4_ = pRVar19->m_height;
  }
  local_230._4_4_ = 0x100;
  if (this->m_dst == TARGET_DEFAULT) {
    pRVar19 = Context::getRenderTarget((this->super_TestCase).m_context);
    SVar31 = pRVar19->m_width;
    pRVar19 = Context::getRenderTarget((this->super_TestCase).m_context);
    local_230._4_4_ = pRVar19->m_height;
  }
  args.src.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(args.src.m_data + 2);
  local_230._0_4_ = SVar31;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"srcSize = ");
  tcu::operator<<((ostream *)poVar2,(Vector<int,_2> *)local_268);
  std::operator<<((ostream *)poVar2,"\n");
  std::operator<<((ostream *)poVar2,"dstSize = ");
  tcu::operator<<((ostream *)poVar2,(Vector<int,_2> *)local_230);
  std::operator<<((ostream *)poVar2,"\n");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&args,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pBVar24 = (pointer)std::__cxx11::ostringstream::~ostringstream(poVar2);
  iVar9 = 0xc;
  local_208 = this;
  while( true ) {
    while( true ) {
      bVar8 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      if (bVar8) {
        return (int)pBVar24;
      }
      tcu::Vector<int,_4>::Vector(&args.src);
      tcu::Vector<int,_4>::Vector(&args.dst);
      tcu::Vector<float,_4>::Vector(&args.bboxMin);
      tcu::Vector<float,_4>::Vector(&args.bboxMax);
      if ((iVar41 < 2) || (this->m_src != TARGET_DEFAULT)) {
        iVar15 = de::Random::getInt(&rnd,1,local_268._0_4_);
        iVar12 = de::Random::getInt(&rnd,1,local_268._4_4_);
        iVar13 = de::Random::getInt(&rnd,0,local_268._0_4_ - iVar15);
        iVar14 = de::Random::getInt(&rnd,0,local_268._4_4_ - iVar12);
        iVar16 = de::Random::getInt(&rnd,1,local_230._0_4_);
        iVar17 = de::Random::getInt(&rnd,1,local_230._4_4_);
        iVar18 = de::Random::getInt(&rnd,iVar16 / -2,(iVar16 + 1) / -2 + local_230._0_4_);
        args.dst.m_data[1] =
             de::Random::getInt(&rnd,iVar17 / -2,(iVar17 + 1) / -2 + local_230._4_4_);
        args.src.m_data[1] = iVar14;
        args.src.m_data[0] = iVar13;
        args.src.m_data[2] = iVar15 + iVar13;
        args.src.m_data[3] = iVar12 + iVar14;
        args.dst.m_data[2] = iVar16 + iVar18;
        args.dst.m_data[3] = iVar17 + args.dst.m_data[1];
        args.dst.m_data[0] = iVar18;
      }
      else {
        SVar31 = local_230._0_4_;
        if ((int)local_268._0_4_ < (int)local_230._0_4_) {
          SVar31 = local_268._0_4_;
        }
        iVar15 = local_230._4_4_;
        if ((int)local_268._4_4_ < (int)local_230._4_4_) {
          iVar15 = local_268._4_4_;
        }
        iVar12 = de::Random::getInt(&rnd,1,SVar31);
        iVar13 = de::Random::getInt(&rnd,1,iVar15);
        iVar14 = de::Random::getInt(&rnd,0,SVar31 - iVar12);
        args.dst.m_data[1] = de::Random::getInt(&rnd,0,iVar15 - iVar13);
        args.src.m_data[1] = args.dst.m_data[1];
        args.src.m_data[0] = iVar14;
        args.src.m_data[2] = iVar12 + iVar14;
        args.src.m_data[3] = iVar13 + args.dst.m_data[1];
        args.dst.m_data[0] = iVar14;
        args.dst.m_data[2] = args.src.m_data[2];
        args.dst.m_data[3] = args.src.m_data[3];
      }
      fVar35 = deRandom_getFloat(&rnd.m_rnd);
      this = local_208;
      args.bboxMin.m_data[0] = fVar35 * 2.2 + -1.1;
      fVar35 = deRandom_getFloat(&rnd.m_rnd);
      args.bboxMin.m_data[1] = fVar35 * 2.2 + -1.1;
      fVar35 = deRandom_getFloat(&rnd.m_rnd);
      args.bboxMin.m_data[2] = fVar35 * 2.2 + -1.1;
      fVar35 = deRandom_getFloat(&rnd.m_rnd);
      args.bboxMin.m_data[3] = fVar35 * 0.20000005 + 0.9;
      fVar35 = deRandom_getFloat(&rnd.m_rnd);
      args.bboxMax.m_data[0] = fVar35 * 2.2 + -1.1;
      fVar35 = deRandom_getFloat(&rnd.m_rnd);
      args.bboxMax.m_data[1] = fVar35 * 2.2 + -1.1;
      fVar35 = deRandom_getFloat(&rnd.m_rnd);
      args.bboxMax.m_data[2] = fVar35 * 2.2 + -1.1;
      fVar36 = deRandom_getFloat(&rnd.m_rnd);
      fVar7 = args.bboxMax.m_data[1];
      fVar6 = args.bboxMin.m_data[2];
      fVar5 = args.bboxMin.m_data[1];
      fVar35 = args.bboxMin.m_data[0];
      args.bboxMax.m_data[3] = fVar36 * 0.20000005 + 0.9;
      auVar39._4_4_ = args.bboxMax.m_data[0];
      auVar39._0_4_ = args.bboxMin.m_data[0];
      auVar39._8_8_ = 0;
      auVar40._4_4_ = args.bboxMax.m_data[3];
      auVar40._0_4_ = args.bboxMin.m_data[3];
      auVar40._8_4_ = args.bboxMax.m_data[1];
      auVar40._12_4_ = args.bboxMax.m_data[2];
      auVar40 = divps(auVar39,auVar40);
      if (auVar40._4_4_ < auVar40._0_4_) {
        args.bboxMin.m_data[0] = args.bboxMax.m_data[0];
        args.bboxMax.m_data[0] = fVar35;
      }
      auVar37._4_4_ = args.bboxMax.m_data[1];
      auVar37._0_4_ = args.bboxMin.m_data[1];
      auVar37._8_8_ = 0;
      auVar3._4_4_ = args.bboxMax.m_data[3];
      auVar3._0_4_ = args.bboxMin.m_data[3];
      auVar3._8_4_ = args.bboxMax.m_data[1];
      auVar3._12_4_ = args.bboxMax.m_data[2];
      auVar40 = divps(auVar37,auVar3);
      if (auVar40._4_4_ < auVar40._0_4_) {
        args.bboxMin.m_data[1] = args.bboxMax.m_data[1];
        args.bboxMax.m_data[1] = fVar5;
      }
      auVar38._4_4_ = args.bboxMax.m_data[2];
      auVar38._0_4_ = args.bboxMin.m_data[2];
      auVar38._8_8_ = 0;
      auVar4._4_4_ = args.bboxMax.m_data[3];
      auVar4._0_4_ = args.bboxMin.m_data[3];
      auVar4._8_4_ = fVar7;
      auVar4._12_4_ = args.bboxMax.m_data[2];
      auVar40 = divps(auVar38,auVar4);
      if (auVar40._4_4_ < auVar40._0_4_) {
        args.bboxMin.m_data[2] = args.bboxMax.m_data[2];
        args.bboxMax.m_data[2] = fVar6;
      }
      args.linear = de::Random::getBool(&rnd);
      pBVar28 = (this->m_iterations).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pBVar28 ==
          (this->m_iterations).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) break;
      BlitArgs::BlitArgs(pBVar28,&args);
      ppBVar1 = &(this->m_iterations).
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
      pBVar24 = extraout_RAX;
    }
    __first = (this->m_iterations).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pBVar28 - (long)__first == 0x7fffffffffffffc4) break;
    uVar25 = ((long)pBVar28 - (long)__first) / 0x44;
    uVar26 = uVar25;
    if (pBVar28 == __first) {
      uVar26 = 1;
    }
    __alloc = (allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs> *)
              (uVar26 + uVar25);
    if ((allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs> *)
        0x1e1e1e1e1e1e1e0 < __alloc) {
      __alloc = (allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs> *
                )0x1e1e1e1e1e1e1e1;
    }
    paVar34 = (allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs> *)
              0x1e1e1e1e1e1e1e1;
    if (!CARRY8(uVar26,uVar25)) {
      paVar34 = __alloc;
    }
    if (paVar34 ==
        (allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs> *)0x0) {
      __result = (BlitArgs *)0x0;
    }
    else {
      __result = (BlitArgs *)operator_new((long)paVar34 * 0x44);
    }
    BlitArgs::BlitArgs(__result + uVar25,&args);
    pBVar27 = std::
              __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs*,deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>>
                        (__first,pBVar28,__result,__alloc);
    pBVar28 = std::
              __uninitialized_move_if_noexcept_a<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs*,deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs*,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>>
                        (pBVar28,pBVar28,pBVar27 + 1,__alloc);
    lVar29 = (long)(this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
    ::_M_deallocate((_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
                     *)__first,(pointer)(lVar29 / 0x44),lVar29 % 0x44);
    (this->m_iterations).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->m_iterations).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar28;
    pBVar24 = __result + (long)paVar34;
    (this->m_iterations).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BlitFboCase::BlitArgs>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pBVar24;
  }
  std::__throw_length_error("vector::_M_realloc_insert");
}

Assistant:

void BlitFboCase::init (void)
{
	const int				numIterations			= 12;
	const bool				defaultFBMultisampled	= (m_context.getRenderTarget().getNumSamples() > 1);
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	de::Random				rnd						(0xABC123);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Using BlitFramebuffer to blit area from "
			<< ((m_src == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< " to "
			<< ((m_dst == TARGET_DEFAULT) ? ("default fb") : ("fbo"))
			<< ".\n"
		<< "Varying blit arguments and primitive bounding box between iterations.\n"
		<< "Expecting bounding box to have no effect on blitting.\n"
		<< "Source framebuffer is filled with green-yellow grid.\n"
		<< tcu::TestLog::EndMessage;

	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_dst == TARGET_DEFAULT && defaultFBMultisampled)
		throw tcu::NotSupportedError("Test requires non-multisampled default framebuffer");

	// resources

	if (m_src == TARGET_FBO)
	{
		m_srcRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_srcRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src rbo");

		m_srcFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_srcFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_srcRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "src fbo");
	}

	if (m_dst == TARGET_FBO)
	{
		m_dstRbo = de::MovePtr<glu::Renderbuffer>(new glu::Renderbuffer(m_context.getRenderContext()));
		gl.bindRenderbuffer(GL_RENDERBUFFER, **m_dstRbo);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, FBO_SIZE, FBO_SIZE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst rbo");

		m_dstFbo = de::MovePtr<glu::Framebuffer>(new glu::Framebuffer(m_context.getRenderContext()));
		gl.bindFramebuffer(GL_FRAMEBUFFER, **m_dstFbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, **m_dstRbo);
		GLU_EXPECT_NO_ERROR(gl.getError(), "dst fbo");
	}

	{
		const char* const vertexSource =	"${GLSL_VERSION_DECL}\n"
													"in highp vec4 a_position;\n"
													"out highp vec4 v_position;\n"
													"void main()\n"
													"{\n"
													"	gl_Position = a_position;\n"
													"	v_position = a_position;\n"
													"}\n";
		const char* const fragmentSource =	"${GLSL_VERSION_DECL}\n"
													"in mediump vec4 v_position;\n"
													"layout(location=0) out mediump vec4 dEQP_FragColor;\n"
													"void main()\n"
													"{\n"
													"	const mediump vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
													"	const mediump vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
													"	dEQP_FragColor = (step(0.1, mod(v_position.x, 0.2)) == step(0.1, mod(v_position.y, 0.2))) ? (green) : (yellow);\n"
													"}\n";

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(specializeShader(m_context, vertexSource)) << glu::FragmentSource(specializeShader(m_context, fragmentSource))));

		if (!m_program->isOk())
		{
			m_testCtx.getLog() << *m_program;
			throw tcu::TestError("failed to build program");
		}
	}

	{
		static const tcu::Vec4 s_quadCoords[] =
		{
			tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
			tcu::Vec4( 1.0f,  1.0f, 0.0f, 1.0f),
		};

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));

		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(s_quadCoords), s_quadCoords, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "set buf");
	}

	// gen iterations

	{
		const tcu::IVec2 srcSize = (m_src == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));
		const tcu::IVec2 dstSize = (m_dst == TARGET_DEFAULT) ? (tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight())) : (tcu::IVec2(FBO_SIZE, FBO_SIZE));

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "srcSize = " << srcSize << "\n"
			<< "dstSize = " << dstSize << "\n"
			<< tcu::TestLog::EndMessage;

		for (int ndx = 0; ndx < numIterations; ++ndx)
		{
			BlitArgs args;

			if (m_src == TARGET_DEFAULT && defaultFBMultisampled)
			{
				const tcu::IVec2	unionSize	= tcu::IVec2(de::min(srcSize.x(), dstSize.x()), de::min(srcSize.y(), dstSize.y()));
				const int			srcWidth	= rnd.getInt(1, unionSize.x());
				const int			srcHeight	= rnd.getInt(1, unionSize.y());
				const int			srcX		= rnd.getInt(0, unionSize.x() - srcWidth);
				const int			srcY		= rnd.getInt(0, unionSize.y() - srcHeight);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;

				args.dst = args.src;
			}
			else
			{
				const int	srcWidth	= rnd.getInt(1, srcSize.x());
				const int	srcHeight	= rnd.getInt(1, srcSize.y());
				const int	srcX		= rnd.getInt(0, srcSize.x() - srcWidth);
				const int	srcY		= rnd.getInt(0, srcSize.y() - srcHeight);
				const int	dstWidth	= rnd.getInt(1, dstSize.x());
				const int	dstHeight	= rnd.getInt(1, dstSize.y());
				const int	dstX		= rnd.getInt(-(dstWidth / 2), dstSize.x() - (dstWidth+1) / 2);		// allow dst go out of bounds
				const int	dstY		= rnd.getInt(-(dstHeight / 2), dstSize.y() - (dstHeight+1)  / 2);

				args.src.x() = srcX;
				args.src.y() = srcY;
				args.src.z() = srcX + srcWidth;
				args.src.w() = srcY + srcHeight;
				args.dst.x() = dstX;
				args.dst.y() = dstY;
				args.dst.z() = dstX + dstWidth;
				args.dst.w() = dstY + dstHeight;
			}

			args.bboxMin.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMin.w() = rnd.getFloat( 0.9f, 1.1f);

			args.bboxMax.x() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.y() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.z() = rnd.getFloat(-1.1f, 1.1f);
			args.bboxMax.w() = rnd.getFloat( 0.9f, 1.1f);

			if (args.bboxMin.x() / args.bboxMin.w() > args.bboxMax.x() / args.bboxMax.w())
				std::swap(args.bboxMin.x(), args.bboxMax.x());
			if (args.bboxMin.y() / args.bboxMin.w() > args.bboxMax.y() / args.bboxMax.w())
				std::swap(args.bboxMin.y(), args.bboxMax.y());
			if (args.bboxMin.z() / args.bboxMin.w() > args.bboxMax.z() / args.bboxMax.w())
				std::swap(args.bboxMin.z(), args.bboxMax.z());

			args.linear = rnd.getBool();

			m_iterations.push_back(args);
		}
	}
}